

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

bool polyscope::view::viewIsValid(void)

{
  bool bVar1;
  int i;
  long lVar2;
  uint *puVar3;
  int j;
  int iVar4;
  
  bVar1 = true;
  lVar2 = 0;
  do {
    iVar4 = 0;
    do {
      puVar3 = (uint *)(&DAT_005fc690 + lVar2 * 0x10);
      if (((iVar4 != 3) && (puVar3 = &DAT_005fc68c + lVar2 * 4, iVar4 != 2)) &&
         (puVar3 = (uint *)(&viewMat + lVar2 * 2), iVar4 == 1)) {
        puVar3 = (uint *)((long)&viewMat + lVar2 * 0x10 + 4);
      }
      iVar4 = iVar4 + 1;
      bVar1 = (bool)(bVar1 & (*puVar3 & 0x7fffffff) < 0x7f800000);
    } while (iVar4 != 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return bVar1;
}

Assistant:

bool viewIsValid() {
  bool allFinite = true;
  for (int i = 0; i < 4; i++) {
    for (int j = 0; j < 4; j++) {
      if (!std::isfinite(viewMat[i][j])) {
        allFinite = false;
      }
    }
  }
  return allFinite;
}